

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O0

string * __thiscall
Quest_Context::SerializeProgress_abi_cxx11_(string *__return_storage_ptr__,Quest_Context *this)

{
  bool bVar1;
  pointer ppVar2;
  const_iterator __x;
  int subject;
  _Self local_68;
  string local_60;
  _Self local_40;
  _Self local_38;
  const_iterator it;
  allocator<char> local_1a;
  undefined1 local_19;
  Quest_Context *local_18;
  Quest_Context *this_local;
  string *serialized;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Quest_Context *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"{",&local_1a)
  ;
  std::allocator<char>::~allocator(&local_1a);
  local_38._M_node =
       (_Base_ptr)
       std::
       cbegin<std::map<std::__cxx11::string,short,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,short>>>>
                 (&this->progress);
  while( true ) {
    local_40._M_node =
         (_Base_ptr)
         std::
         cend<std::map<std::__cxx11::string,short,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,short>>>>
                   (&this->progress);
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>
             ::operator->(&local_38);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)ppVar2);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"=");
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>
             ::operator->(&local_38);
    util::to_string_abi_cxx11_(&local_60,(util *)(ulong)(uint)(int)ppVar2->second,subject);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    __x = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
          ::cend(&this->progress);
    local_68._M_node =
         (_Base_ptr)
         std::prev<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,short>>>
                   (__x._M_node,1);
    bVar1 = std::operator!=(&local_38,&local_68);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,",");
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>
    ::operator++(&local_38);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"}");
  return __return_storage_ptr__;
}

Assistant:

std::string Quest_Context::SerializeProgress() const
{
	std::string serialized = "{";

	UTIL_CIFOREACH(this->progress, it)
	{
		serialized += it->first;
		serialized += "=";
		serialized += util::to_string(it->second);

		if (it != std::prev(this->progress.cend()))
		{
			serialized += ",";
		}
	}

	serialized += "}";

	return serialized;
}